

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O2

void __thiscall
utObjImportExport_no_vt_just_vns_Test::TestBody(utObjImportExport_no_vt_just_vns_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  Importer myImporter;
  AssertionResult gtest_ar;
  aiScene *scene;
  
  Assimp::Importer::Importer(&myImporter);
  message = "";
  scene = Assimp::Importer::ReadFileFromMemory
                    (&myImporter,
                     "v 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 10 0 0\nv 0 10 0\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nf 10/10 11/11 12/12\n"
                     ,0xe2,0,"");
  local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&gtest_ar,"nullptr","scene",&local_40.ptr_,&scene);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1a8,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Assimp::Importer::~Importer(&myImporter);
  return;
}

Assistant:

TEST_F(utObjImportExport, no_vt_just_vns) {
    static const char *ObjModel =
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 10 0 0\n"
		"v 0 10 0\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"f 10/10 11/11 12/12\n";

    Assimp::Importer myImporter;
    const aiScene *scene = myImporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), 0);
    EXPECT_NE(nullptr, scene);
}